

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O2

bool __thiscall SampleMuxerMetadata::LoadChapters(SampleMuxerMetadata *this,char *file)

{
  bool bVar1;
  cue_list_t cues;
  _List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_> local_28;
  
  local_28._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_28;
  local_28._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_28;
  if ((this->chapter_cues_).super__List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>.
      _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->chapter_cues_) {
    local_28._M_impl._M_node._M_size = 0;
    bVar1 = ParseChapters(file,(cue_list_t *)&local_28);
    if (bVar1) {
      std::__cxx11::list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>::swap
                (&this->chapter_cues_,
                 (list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_> *)&local_28);
    }
    std::__cxx11::_List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>::_M_clear(&local_28);
  }
  else {
    puts("Support for more than one chapters file is not yet implemented");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SampleMuxerMetadata::LoadChapters(const char* file) {
  if (!chapter_cues_.empty()) {
    printf("Support for more than one chapters file is not yet implemented\n");
    return false;
  }

  cue_list_t cues;

  if (!ParseChapters(file, &cues))
    return false;

  // TODO(matthewjheaney): support more than one chapters file
  chapter_cues_.swap(cues);

  return true;
}